

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O2

idx_t __thiscall
duckdb::PhysicalRecursiveCTE::ProbeHT
          (PhysicalRecursiveCTE *this,DataChunk *chunk,RecursiveCTEState *state)

{
  pointer this_00;
  idx_t count_p;
  LogicalType LStack_98;
  Vector dummy_addresses;
  
  LogicalType::LogicalType(&LStack_98,POINTER);
  Vector::Vector(&dummy_addresses,&LStack_98,0x800);
  LogicalType::~LogicalType(&LStack_98);
  this_00 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
            ::operator->(&state->ht);
  count_p = GroupedAggregateHashTable::FindOrCreateGroups
                      (this_00,chunk,&dummy_addresses,&state->new_groups);
  DataChunk::Slice(chunk,&state->new_groups,count_p);
  Vector::~Vector(&dummy_addresses);
  return count_p;
}

Assistant:

idx_t PhysicalRecursiveCTE::ProbeHT(DataChunk &chunk, RecursiveCTEState &state) const {
	Vector dummy_addresses(LogicalType::POINTER);

	// Use the HT to eliminate duplicate rows
	idx_t new_group_count = state.ht->FindOrCreateGroups(chunk, dummy_addresses, state.new_groups);

	// we only return entries we have not seen before (i.e. new groups)
	chunk.Slice(state.new_groups, new_group_count);

	return new_group_count;
}